

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLInputUnshared.cpp
# Opt level: O0

String * COLLADASaxFWL::InputUnshared::getSemanticAsString_abi_cxx11_(Semantic semantic)

{
  Semantic semantic_local;
  String *local_8;
  
  switch(semantic) {
  case BINORMAL:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_BINORMAL_abi_cxx11_;
    break;
  case COLOR:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_COLOR_abi_cxx11_;
    break;
  case CONTINUITY:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_CONTINUITY_abi_cxx11_;
    break;
  case IMAGE:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_IMAGE_abi_cxx11_;
    break;
  case INPUT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_INPUT_abi_cxx11_;
    break;
  case IN_TANGENT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_IN_TANGENT_abi_cxx11_;
    break;
  case INTERPOLATION:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_INTERPOLATION_abi_cxx11_;
    break;
  case INV_BIND_MATRIX:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_INV_BIND_MATRIX_abi_cxx11_;
    break;
  case JOINT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_JOINT_abi_cxx11_;
    break;
  case LINEAR_STEPS:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_LINEAR_STEPS_abi_cxx11_;
    break;
  case MORPH_TARGET:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_MORPH_TARGET_abi_cxx11_;
    break;
  case MORPH_WEIGHT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_MORPH_WEIGHT_abi_cxx11_;
    break;
  case NORMAL:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_NORMAL_abi_cxx11_;
    break;
  case OUTPUT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_OUTPUT_abi_cxx11_;
    break;
  case OUT_TANGENT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_OUT_TANGENT_abi_cxx11_;
    break;
  case POSITION:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_POSITION_abi_cxx11_;
    break;
  case TANGENT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_TANGENT_abi_cxx11_;
    break;
  case TEXBINORMAL:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_TEXBINORMAL_abi_cxx11_;
    break;
  case TEXCOORD:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_TEXCOORD_abi_cxx11_;
    break;
  case TEXTANGENT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_TEXTANGENT_abi_cxx11_;
    break;
  case UV:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_UV_abi_cxx11_;
    break;
  case VERTEX:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_VERTEX_abi_cxx11_;
    break;
  case WEIGHT:
    local_8 = (String *)COLLADAFW::Constants::SEMANTIC_WEIGHT_abi_cxx11_;
    break;
  case UNKNOWN:
  default:
    local_8 = (String *)COLLADAFW::Constants::EMPTY_STRING_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const String& InputUnshared::getSemanticAsString ( const InputSemantic::Semantic semantic )
    {
        switch ( semantic )
        {
        case InputSemantic::BINORMAL: return Constants::SEMANTIC_BINORMAL;
        case InputSemantic::COLOR: return Constants::SEMANTIC_COLOR;
        case InputSemantic::CONTINUITY: return Constants::SEMANTIC_CONTINUITY;
        case InputSemantic::IMAGE: return Constants::SEMANTIC_IMAGE;
        case InputSemantic::INPUT: return Constants::SEMANTIC_INPUT;
        case InputSemantic::IN_TANGENT: return Constants::SEMANTIC_IN_TANGENT;
        case InputSemantic::INTERPOLATION: return Constants::SEMANTIC_INTERPOLATION;
        case InputSemantic::INV_BIND_MATRIX: return Constants::SEMANTIC_INV_BIND_MATRIX;
        case InputSemantic::JOINT: return Constants::SEMANTIC_JOINT;
        case InputSemantic::LINEAR_STEPS: return Constants::SEMANTIC_LINEAR_STEPS;
        case InputSemantic::MORPH_TARGET: return Constants::SEMANTIC_MORPH_TARGET;
        case InputSemantic::MORPH_WEIGHT: return Constants::SEMANTIC_MORPH_WEIGHT;
        case InputSemantic::NORMAL: return Constants::SEMANTIC_NORMAL;
        case InputSemantic::OUTPUT: return Constants::SEMANTIC_OUTPUT;
        case InputSemantic::OUT_TANGENT: return Constants::SEMANTIC_OUT_TANGENT;
        case InputSemantic::POSITION: return Constants::SEMANTIC_POSITION;
        case InputSemantic::TANGENT: return Constants::SEMANTIC_TANGENT;
        case InputSemantic::TEXBINORMAL: return Constants::SEMANTIC_TEXBINORMAL;
        case InputSemantic::TEXCOORD: return Constants::SEMANTIC_TEXCOORD;
        case InputSemantic::TEXTANGENT: return Constants::SEMANTIC_TEXTANGENT;
        case InputSemantic::UV: return Constants::SEMANTIC_UV;
        case InputSemantic::VERTEX: return Constants::SEMANTIC_VERTEX;
        case InputSemantic::WEIGHT: return Constants::SEMANTIC_WEIGHT;
        case InputSemantic::UNKNOWN:  
        default: return Constants::EMPTY_STRING;
        }
    }